

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

void __thiscall
despot::BaseRockSample::PrintBelief(BaseRockSample *this,Belief *belief,ostream *out)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference ppSVar6;
  reference pvVar7;
  ostream *poVar8;
  undefined8 local_94;
  int local_8c;
  int local_88;
  int i_1;
  int rock_1;
  int rock;
  State *particle;
  int i;
  vector<double,_std::allocator<double>_> pos_probs;
  allocator<double> local_41;
  undefined1 local_40 [8];
  vector<double,_std::allocator<double>_> rock_probs;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles;
  ostream *out_local;
  Belief *belief_local;
  BaseRockSample *this_local;
  
  rock_probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)(**(code **)(*(long *)belief + 0x30))();
  iVar2 = this->num_rocks_;
  std::allocator<double>::allocator(&local_41);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_40,(long)iVar2,&local_41);
  std::allocator<double>::~allocator(&local_41);
  iVar2 = this->size_;
  std::allocator<double>::allocator((allocator<double> *)((long)&particle + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&i,(ulong)(uint)(iVar2 * iVar2),
             (allocator<double> *)((long)&particle + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&particle + 7));
  particle._0_4_ = 0;
  while( true ) {
    uVar4 = (ulong)(int)particle;
    sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                      ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                       rock_probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    if (sVar5 <= uVar4) break;
    ppSVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                         rock_probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(int)particle);
    _rock_1 = *ppSVar6;
    for (i_1 = 0; i_1 < this->num_rocks_; i_1 = i_1 + 1) {
      bVar3 = CheckFlag(*(int *)(_rock_1 + 0xc),i_1);
      dVar1 = *(double *)(_rock_1 + 0x18);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_40,(long)i_1);
      *pvVar7 = (double)bVar3 * dVar1 + *pvVar7;
    }
    dVar1 = *(double *)(_rock_1 + 0x18);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&i,
                        (long)(*(int *)(_rock_1 + 0xc) >> ((byte)this->num_rocks_ & 0x1f)));
    *pvVar7 = dVar1 + *pvVar7;
    particle._0_4_ = (int)particle + 1;
  }
  std::operator<<(out,"Rock belief:");
  for (local_88 = 0; local_88 < this->num_rocks_; local_88 = local_88 + 1) {
    poVar8 = std::operator<<(out," ");
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_40,(long)local_88);
    std::ostream::operator<<(poVar8,*pvVar7);
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  std::operator<<(out,"Position belief:");
  local_8c = 0;
  while( true ) {
    uVar4 = (ulong)local_8c;
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)&i);
    if (sVar5 <= uVar4) break;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&i,(long)local_8c);
    if (0.0 < *pvVar7) {
      poVar8 = std::operator<<(out," ");
      local_94 = IndexToCoord(this,local_8c);
      poVar8 = (ostream *)despot::operator<<(poVar8,(Coord *)&local_94);
      poVar8 = std::operator<<(poVar8,":");
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&i,(long)local_8c);
      std::ostream::operator<<(poVar8,*pvVar7);
    }
    local_8c = local_8c + 1;
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&i);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_40);
  return;
}

Assistant:

void BaseRockSample::PrintBelief(const Belief& belief, ostream& out) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief&>(belief).particles();

	vector<double> rock_probs(num_rocks_);
	vector<double> pos_probs(size_ * size_);
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		for (int rock = 0; rock < num_rocks_; rock++)
			rock_probs[rock] += CheckFlag(particle->state_id, rock)
				* particle->weight;
		pos_probs[particle->state_id >> num_rocks_] += particle->weight;
	}

	out << "Rock belief:";
	for (int rock = 0; rock < num_rocks_; rock++)
		out << " " << rock_probs[rock];
	out << endl;

	out << "Position belief:";
	for (int i = 0; i < pos_probs.size(); i++) {
		if (pos_probs[i] > 0)
			out << " " << IndexToCoord(i) << ":" << pos_probs[i];
	}
	out << endl;
}